

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall
ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
          (ON__CChangeTextureCoordinateHelper *this,ON_Mesh *mesh,int newvcnt,float **mesh_T)

{
  int iVar1;
  uint uVar2;
  ON_2fPoint *pOVar3;
  ON_TextureCoordinates *pOVar4;
  float *pfVar5;
  bool bVar6;
  bool *pbVar7;
  uint uVar8;
  ON_Mesh *pOVar9;
  size_t new_capacity;
  long lVar10;
  ON_TextureCoordinates *local_38;
  
  this->m_mesh = mesh;
  this->m_mesh_dV = (ON_3dPointArray *)0x0;
  (this->m_TC)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008139a8;
  (this->m_TC).m_a = (ON_TextureCoordinates **)0x0;
  (this->m_TC).m_count = 0;
  (this->m_TC).m_capacity = 0;
  this->m_vuse_count = 0;
  (this->m_vuse)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
  (this->m_vuse).m_a = (uint *)0x0;
  (this->m_vuse).m_count = 0;
  (this->m_vuse).m_capacity = 0;
  ON_Mesh::DestroyTopology(mesh);
  ON_Mesh::DestroyPartition(this->m_mesh);
  ON_Mesh::DestroyTree(this->m_mesh,true);
  this->m_tci = -1;
  pOVar9 = this->m_mesh;
  iVar1 = (pOVar9->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar8 = newvcnt + iVar1;
  new_capacity = (size_t)(int)uVar8;
  if ((uint)(pOVar9->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar8) {
    ON_SimpleArray<ON_3fPoint>::SetCapacity
              (&(pOVar9->m_V).super_ON_SimpleArray<ON_3fPoint>,new_capacity);
    pOVar9 = this->m_mesh;
  }
  bVar6 = ON_Mesh::HasDoublePrecisionVertices(pOVar9);
  pOVar9 = this->m_mesh;
  if (bVar6) {
    this->m_mesh_dV = &pOVar9->m_dV;
    if ((uint)(pOVar9->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar8) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                (&(pOVar9->m_dV).super_ON_SimpleArray<ON_3dPoint>,new_capacity);
    }
  }
  else {
    ON_Mesh::DestroyDoublePrecisionVertices(pOVar9);
  }
  bVar6 = ON_Mesh::HasVertexNormals(this->m_mesh);
  this->m_bHasVertexNormals = bVar6;
  pOVar9 = this->m_mesh;
  if ((bVar6) && ((uint)(pOVar9->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar8)) {
    ON_SimpleArray<ON_3fVector>::SetCapacity
              (&(pOVar9->m_N).super_ON_SimpleArray<ON_3fVector>,new_capacity);
    pOVar9 = this->m_mesh;
  }
  bVar6 = ON_Mesh::HasTextureCoordinates(pOVar9);
  this->m_bHasVertexTextures = bVar6;
  pOVar9 = this->m_mesh;
  if (bVar6) {
    pOVar3 = (pOVar9->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    if ((uint)(pOVar9->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar8) {
      ON_SimpleArray<ON_2fPoint>::SetCapacity
                (&(pOVar9->m_T).super_ON_SimpleArray<ON_2fPoint>,new_capacity);
      pOVar9 = this->m_mesh;
    }
    if (pOVar3 == (ON_2fPoint *)*mesh_T) {
      *mesh_T = &((pOVar9->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x;
      pOVar9 = this->m_mesh;
    }
  }
  bVar6 = ON_Mesh::HasVertexColors(pOVar9);
  this->m_bHasVertexColors = bVar6;
  pOVar9 = this->m_mesh;
  if ((bVar6) && ((uint)(pOVar9->m_C).m_capacity < uVar8)) {
    ON_SimpleArray<ON_Color>::SetCapacity(&pOVar9->m_C,new_capacity);
    pOVar9 = this->m_mesh;
  }
  bVar6 = ON_Mesh::HasSurfaceParameters(pOVar9);
  this->m_bHasSurfaceParameters = bVar6;
  pOVar9 = this->m_mesh;
  if ((bVar6) && ((uint)(pOVar9->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar8)) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity
              (&(pOVar9->m_S).super_ON_SimpleArray<ON_2dPoint>,new_capacity);
    pOVar9 = this->m_mesh;
  }
  bVar6 = ON_Mesh::HasPrincipalCurvatures(pOVar9);
  this->m_bHasPrincipalCurvatures = bVar6;
  pOVar9 = this->m_mesh;
  if ((bVar6) && ((uint)(pOVar9->m_K).m_capacity < uVar8)) {
    ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&pOVar9->m_K,new_capacity);
    pOVar9 = this->m_mesh;
  }
  pbVar7 = ON_Mesh::HiddenVertexArray(pOVar9);
  this->m_bHasHiddenVertices = pbVar7 != (bool *)0x0;
  pOVar9 = this->m_mesh;
  if ((pbVar7 != (bool *)0x0) && ((uint)(pOVar9->m_H).m_capacity < uVar8)) {
    ON_SimpleArray<bool>::SetCapacity(&pOVar9->m_H,new_capacity);
    pOVar9 = this->m_mesh;
  }
  this->m_bHasCachedTextures = false;
  uVar2 = (pOVar9->m_TC).m_count;
  if ((uint)(this->m_TC).m_capacity < uVar2) {
    ON_SimpleArray<ON_TextureCoordinates_*>::SetCapacity(&this->m_TC,(long)(int)uVar2);
  }
  if (0 < (int)uVar2) {
    lVar10 = 0;
    do {
      pOVar4 = (this->m_mesh->m_TC).m_a;
      if (iVar1 == *(int *)((long)&(pOVar4->m_T).m_count + lVar10)) {
        this->m_bHasCachedTextures = true;
        pfVar5 = *(float **)((long)&(pOVar4->m_T).m_a + lVar10);
        if (*(uint *)((long)&(pOVar4->m_T).m_capacity + lVar10) < uVar8) {
          ON_SimpleArray<ON_3fPoint>::SetCapacity
                    ((ON_SimpleArray<ON_3fPoint> *)
                     ((long)&(pOVar4->m_T)._vptr_ON_SimpleArray + lVar10),new_capacity);
        }
        if (pfVar5 == *mesh_T) {
          *mesh_T = *(float **)((long)&(pOVar4->m_T).m_a + lVar10);
        }
        local_38 = (ON_TextureCoordinates *)((pOVar4->m_tag).m_mapping_id.Data4 + lVar10 + -8);
        ON_SimpleArray<ON_TextureCoordinates_*>::Append(&this->m_TC,&local_38);
      }
      lVar10 = lVar10 + 0xb8;
    } while ((long)(int)uVar2 * 0xb8 - lVar10 != 0);
  }
  return;
}

Assistant:

ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper(
    ON_Mesh& mesh,
    int newvcnt,
    float*& mesh_T )
: m_mesh(mesh)
, m_mesh_dV(0)
, m_vuse_count(0)
{
  // adding vertices invalidates this cached information.
  m_mesh.DestroyTopology();
  m_mesh.DestroyPartition();
  m_mesh.DestroyTree();

  m_tci = -1;

  const int vcnt = m_mesh.m_V.Count();

  // It is critical to reserve enough room in the arrays
  // before duplication starts.  Otherwise, during duplication,
  // a dynamic array can be reallocated, which will make
  // saved array base pointers will be invalid, and you crash
  // the next time they are used.

  m_mesh.m_V.Reserve(vcnt+newvcnt);

  if ( m_mesh.HasDoublePrecisionVertices() )
  {
    m_mesh_dV = &m_mesh.m_dV;
    m_mesh_dV->Reserve(vcnt+newvcnt);
  }
  else
  {
    m_mesh.DestroyDoublePrecisionVertices();
  }

  m_bHasVertexNormals = m_mesh.HasVertexNormals();
  if ( m_bHasVertexNormals )
    m_mesh.m_N.Reserve(vcnt+newvcnt);

  m_bHasVertexTextures = m_mesh.HasTextureCoordinates();
  if ( m_bHasVertexTextures )
  {
    float* p = (float*)m_mesh.m_T.Array();
    m_mesh.m_T.Reserve(vcnt+newvcnt);
    if ( p == mesh_T )
      mesh_T = (float*)m_mesh.m_T.Array();
  }

  m_bHasVertexColors = m_mesh.HasVertexColors();
  if ( m_bHasVertexColors )
    m_mesh.m_C.Reserve(vcnt+newvcnt);

  m_bHasSurfaceParameters = m_mesh.HasSurfaceParameters();
  if ( m_bHasSurfaceParameters )
    m_mesh.m_S.Reserve(vcnt+newvcnt);

  m_bHasPrincipalCurvatures = m_mesh.HasPrincipalCurvatures();
  if ( m_bHasPrincipalCurvatures )
    m_mesh.m_K.Reserve(vcnt+newvcnt);

  m_bHasHiddenVertices = (0 != m_mesh.HiddenVertexArray());
  if ( m_bHasHiddenVertices )
    m_mesh.m_H.Reserve(vcnt+newvcnt);

  // Set m_TC[] to be the subset of m_mesh.m_TC[] that is
  // valid for duplication.
  m_bHasCachedTextures = false;
  int tci, tccount = m_mesh.m_TC.Count();
  m_TC.Reserve(tccount);
  for ( tci = 0; tci < tccount; tci++ )
  {
    ON_TextureCoordinates& tc = m_mesh.m_TC[tci];
    if ( vcnt == tc.m_T.Count() )
    {
      m_bHasCachedTextures = true;
      float* p = (float*)tc.m_T.Array();
      tc.m_T.Reserve(vcnt+newvcnt);
      if ( p == mesh_T )
        mesh_T = (float*)tc.m_T.Array();
      m_TC.Append( &tc );
    }
  }
}